

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CRTC6845.hpp
# Opt level: O1

void __thiscall
Motorola::CRTC::
CRTC6845<PCCompatible::MDA::CRTCOutputter,_(Motorola::CRTC::Personality)0,_(Motorola::CRTC::CursorType)1>
::run_for(CRTC6845<PCCompatible::MDA::CRTCOutputter,_(Motorola::CRTC::Personality)0,_(Motorola::CRTC::CursorType)1>
          *this,Cycles cycles)

{
  ushort uVar1;
  uint uVar2;
  ushort uVar3;
  bool bVar4;
  IntType cyles_remaining;
  
  if (cycles.super_WrappedInt<Cycles>.length_ != 0) {
    do {
      if (this->character_counter_ == (this->layout_).horizontal.displayed) {
        this->character_is_visible_ = false;
        this->end_of_line_address_ = (this->bus_state_).refresh_address;
      }
      uVar2 = (uint)this->character_is_visible_ + this->character_is_visible_shifter_ * 2;
      this->character_is_visible_shifter_ = uVar2;
      bVar4 = this->line_is_visible_;
      if ((uVar2 & this->display_skew_mask_) == 0) {
        bVar4 = false;
      }
      (this->bus_state_).display_enable = bVar4;
      PCCompatible::MDA::CRTCOutputter::perform_bus_cycle_phase1
                (this->bus_handler_,&this->bus_state_);
      uVar1 = (this->layout_).cursor_address;
      uVar3 = (this->bus_state_).refresh_address + 1 & 0x3fff;
      (this->bus_state_).refresh_address = uVar3;
      (this->bus_state_).cursor = (bool)(uVar3 == uVar1 & this->is_cursor_line_);
      if (this->character_counter_ == (this->layout_).horizontal.total) {
        this->character_counter_ = '\0';
        do_end_of_line(this);
        this->character_is_visible_ = true;
      }
      else {
        this->character_counter_ = this->character_counter_ + '\x01';
      }
      if (this->character_counter_ == (this->layout_).horizontal.start_sync) {
        this->hsync_counter_ = 0;
        (this->bus_state_).hsync = true;
      }
      if ((this->bus_state_).hsync == true) {
        uVar2 = this->hsync_counter_;
        (this->bus_state_).hsync = uVar2 != (this->layout_).horizontal.sync_width;
        this->hsync_counter_ = uVar2 + 1 & 0xf;
      }
      cycles.super_WrappedInt<Cycles>.length_ =
           (WrappedInt<Cycles>)((long)cycles.super_WrappedInt<Cycles>.length_ + -1);
    } while (cycles.super_WrappedInt<Cycles>.length_ != 0);
  }
  return;
}

Assistant:

void run_for(Cycles cycles) {
			auto cyles_remaining = cycles.as_integral();
			while(cyles_remaining--) {
				// Check for end of visible characters.
				if(character_counter_ == layout_.horizontal.displayed) {
					// TODO: consider skew in character_is_visible_. Or maybe defer until perform_bus_cycle?
					character_is_visible_ = false;
					end_of_line_address_ = bus_state_.refresh_address;
				}

				perform_bus_cycle_phase1();
				bus_state_.refresh_address = (bus_state_.refresh_address + 1) & RefreshMask;

				bus_state_.cursor = is_cursor_line_ &&
					bus_state_.refresh_address == layout_.cursor_address;

				// Check for end-of-line.
				if(character_counter_ == layout_.horizontal.total) {
					character_counter_ = 0;
					do_end_of_line();
					character_is_visible_ = true;
				} else {
					// Increment counter.
					character_counter_++;
				}

				// Check for start of horizontal sync.
				if(character_counter_ == layout_.horizontal.start_sync) {
					hsync_counter_ = 0;
					bus_state_.hsync = true;
				}

				// Check for end of horizontal sync; note that a sync time of zero will result in an immediate
				// cancellation of the plan to perform sync if this is an HD6845S or UM6845R; otherwise zero
				// will end up counting as 16 as it won't be checked until after overflow.
				if(bus_state_.hsync) {
					switch(personality) {
						case Personality::HD6845S:
						case Personality::UM6845R:
							bus_state_.hsync = hsync_counter_ != layout_.horizontal.sync_width;
							hsync_counter_ = (hsync_counter_ + 1) & 15;
						break;
						default:
							hsync_counter_ = (hsync_counter_ + 1) & 15;
							bus_state_.hsync = hsync_counter_ != layout_.horizontal.sync_width;
						break;
					}
				}

				perform_bus_cycle_phase2();
			}
		}